

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

char p_b_coll_elem(parse *p,int endc)

{
  char *__s2;
  char *__s1;
  int iVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
  __s2 = p->next;
  lVar4 = 0;
  lVar3 = 0;
  do {
    if (p->end <= __s2 + lVar3) {
      if (p->error == 0) {
        p->error = 7;
      }
LAB_00106958:
      p->next = nuls;
      p->end = nuls;
      return '\0';
    }
    pcVar2 = __s2 + lVar3 + 1;
    if (((pcVar2 < p->end) && (__s2[lVar3] == endc)) && (*pcVar2 == ']')) {
      for (pcVar2 = &cnames[0].code; __s1 = ((cname *)(pcVar2 + -8))->name, __s1 != (char *)0x0;
          pcVar2 = pcVar2 + 0x10) {
        iVar1 = strncmp(__s1,__s2,lVar4 >> 0x20);
        if ((iVar1 == 0) && (__s1[lVar4 >> 0x20] == '\0')) {
          return *pcVar2;
        }
      }
      if ((int)lVar3 == 1) {
        return *__s2;
      }
      if (p->error == 0) {
        p->error = 3;
      }
      goto LAB_00106958;
    }
    p->next = pcVar2;
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x100000000;
  } while( true );
}

Assistant:

static char			/* value of collating element */
p_b_coll_elem(p, endc)
register struct parse *p;
int endc;			/* name ended by endc,']' */
{
	register char *sp = p->next;
	register struct cname *cp;
	register int len;

	while (MORE() && !SEETWO(endc, ']'))
		NEXT();
	if (!MORE()) {
		SETERROR(REG_EBRACK);
		return(0);
	}
	len = (int) (p->next - sp);
	for (cp = cnames; cp->name != NULL; cp++)
		if (strncmp(cp->name, sp, len) == 0 && cp->name[len] == '\0')
			return(cp->code);	/* known name */
	if (len == 1)
		return(*sp);	/* single character */
	SETERROR(REG_ECOLLATE);			/* neither */
	return(0);
}